

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O3

void small_alloc_destroy(small_alloc *alloc)

{
  mempool *pool;
  ulong uVar1;
  
  if (alloc->small_mempool_cache_size != 0) {
    pool = &alloc->small_mempool_cache[0].pool;
    uVar1 = 0;
    do {
      uVar1 = uVar1 + 1;
      mempool_destroy(pool);
      pool = (mempool *)&pool[1].hot_slabs;
    } while (uVar1 < alloc->small_mempool_cache_size);
  }
  return;
}

Assistant:

struct mempool *
mempool_iterator_next(struct mempool_iterator *it)
{
	struct small_mempool *small_mempool = NULL;
	if (it->small_iterator < it->alloc->small_mempool_cache_size)
		small_mempool =
			&it->alloc->small_mempool_cache[(it->small_iterator)++];
	if (small_mempool)
		return &(small_mempool->pool);

	return NULL;
}